

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateCropLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  int iVar2;
  uint uVar3;
  pointer pcVar4;
  long lVar5;
  uint uVar6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_01;
  uint uVar7;
  bool bVar8;
  Type *pTVar9;
  iterator iVar10;
  mapped_type *pmVar11;
  undefined1 *puVar12;
  long *plVar13;
  undefined8 *puVar14;
  uint uVar15;
  ulong *puVar16;
  ulong uVar17;
  Result *_result;
  undefined8 uVar18;
  uint uVar19;
  _Rb_tree_header *p_Var20;
  string err;
  string local_f8;
  long *local_d8;
  undefined8 local_d0;
  long local_c8;
  undefined8 uStack_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,2);
  bVar8 = Result::good(__return_storage_ptr__);
  if (!bVar8) {
    return __return_storage_ptr__;
  }
  pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar8) {
    return __return_storage_ptr__;
  }
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar8 = Result::good(__return_storage_ptr__);
  if (!bVar8) {
    return __return_storage_ptr__;
  }
  pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar8) {
    return __return_storage_ptr__;
  }
  if (this->ndArrayInterpretation == true) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Crop","");
    local_78 = &this->blobNameToRank;
    validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_50,local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar8 = Result::good(__return_storage_ptr__);
    if (!bVar8) {
      return __return_storage_ptr__;
    }
    pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != paVar1) {
      operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
    }
    if (!bVar8) {
      return __return_storage_ptr__;
    }
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Crop","");
    validateRankCount(__return_storage_ptr__,layer,&local_f8,3,-1,local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    bVar8 = Result::good(__return_storage_ptr__);
    if (!bVar8) {
      return __return_storage_ptr__;
    }
    pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != paVar1) {
      operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
    }
    if (!bVar8) {
      return __return_storage_ptr__;
    }
    if (1 < (layer->input_).super_RepeatedPtrFieldBase.current_size_) {
      this_00 = &layer->input_;
      pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,0);
      iVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::find(&local_78->_M_t,pTVar9);
      p_Var20 = &(this->blobNameToRank)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)iVar10._M_node != p_Var20) {
        pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,1);
        iVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::find(&local_78->_M_t,pTVar9);
        if ((_Rb_tree_header *)iVar10._M_node != p_Var20) {
          pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this_00->super_RepeatedPtrFieldBase,0);
          this_01 = local_78;
          pmVar11 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::at(local_78,pTVar9);
          iVar2 = *pmVar11;
          pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this_00->super_RepeatedPtrFieldBase,1);
          pmVar11 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::at(this_01,pTVar9);
          if (iVar2 != *pmVar11) {
            local_f8._M_string_length = 0;
            local_f8.field_2._M_allocated_capacity =
                 local_f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
            plVar13 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
            lVar5 = *plVar13;
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char*>((string *)&local_70,lVar5,plVar13[1] + lVar5);
            std::operator+(&local_b8,"Layer \'",&local_70);
            puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
            plVar13 = puVar14 + 2;
            if ((long *)*puVar14 == plVar13) {
              local_c8 = *plVar13;
              uStack_c0 = puVar14[3];
              local_d8 = &local_c8;
            }
            else {
              local_c8 = *plVar13;
              local_d8 = (long *)*puVar14;
            }
            local_d0 = puVar14[1];
            *puVar14 = plVar13;
            puVar14[1] = 0;
            *(undefined1 *)(puVar14 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_d8);
            if (local_d8 != &local_c8) {
              operator_delete(local_d8,local_c8 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
              return __return_storage_ptr__;
            }
            goto LAB_00362c6e;
          }
        }
      }
    }
  }
  if (layer->_oneof_case_[0] == 0xbe) {
    puVar12 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar12 = Specification::_CropLayerParams_default_instance_;
  }
  if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ == 1) {
    puVar12 = (undefined1 *)((BatchnormLayerParams *)puVar12)->variance_;
    if ((WeightParams *)puVar12 == (WeightParams *)0x0) {
      puVar12 = Specification::_BorderAmounts_default_instance_;
    }
    if (*(int *)&(((WeightParams *)puVar12)->floatvalue_).arena_or_elements_ == 2) {
LAB_0036273b:
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    std::operator+(&local_70,"cropAmounts parameter for the crop layer \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_70);
    paVar1 = &local_b8.field_2;
    puVar16 = (ulong *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_b8.field_2._M_allocated_capacity = *puVar16;
      local_b8.field_2._8_8_ = plVar13[3];
      local_b8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *puVar16;
      local_b8._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_b8._M_string_length = plVar13[1];
    *plVar13 = (long)puVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    if (layer->_oneof_case_[0] == 0xbe) {
      puVar12 = *(undefined1 **)&layer->layer_;
    }
    else {
      puVar12 = Specification::_CropLayerParams_default_instance_;
    }
    puVar12 = (undefined1 *)((BatchnormLayerParams *)puVar12)->variance_;
    if ((WeightParams *)puVar12 == (WeightParams *)0x0) {
      puVar12 = Specification::_BorderAmounts_default_instance_;
    }
    uVar3 = *(uint *)&(((WeightParams *)puVar12)->floatvalue_).arena_or_elements_;
    uVar6 = -uVar3;
    if (0 < (int)uVar3) {
      uVar6 = uVar3;
    }
    uVar19 = 1;
    if (9 < uVar6) {
      uVar17 = (ulong)uVar6;
      uVar7 = 4;
      do {
        uVar19 = uVar7;
        uVar15 = (uint)uVar17;
        if (uVar15 < 100) {
          uVar19 = uVar19 - 2;
          goto LAB_00362913;
        }
        if (uVar15 < 1000) {
          uVar19 = uVar19 - 1;
          goto LAB_00362913;
        }
        if (uVar15 < 10000) goto LAB_00362913;
        uVar17 = uVar17 / 10000;
        uVar7 = uVar19 + 4;
      } while (99999 < uVar15);
      uVar19 = uVar19 + 1;
    }
LAB_00362913:
    local_98 = local_88;
    std::__cxx11::string::_M_construct((ulong)&local_98,(char)uVar19 - (char)((int)uVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_98),uVar19,uVar6);
    uVar18 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      uVar18 = local_b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar18 < local_90 + local_b8._M_string_length) {
      uVar17 = 0xf;
      if (local_98 != local_88) {
        uVar17 = local_88[0];
      }
      if (uVar17 < local_90 + local_b8._M_string_length) goto LAB_00362982;
      puVar14 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_98,0,(char *)0x0,(ulong)local_b8._M_dataplus._M_p);
    }
    else {
LAB_00362982:
      puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_98);
    }
    local_d8 = &local_c8;
    plVar13 = puVar14 + 2;
    if ((long *)*puVar14 == plVar13) {
      local_c8 = *plVar13;
      uStack_c0 = puVar14[3];
    }
    else {
      local_c8 = *plVar13;
      local_d8 = (long *)*puVar14;
    }
    local_d0 = puVar14[1];
    *puVar14 = plVar13;
    puVar14[1] = 0;
    *(undefined1 *)plVar13 = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_d8);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    puVar16 = (ulong *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_f8.field_2._M_allocated_capacity = *puVar16;
      local_f8.field_2._8_8_ = plVar13[3];
    }
    else {
      local_f8.field_2._M_allocated_capacity = *puVar16;
      local_f8._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_f8._M_string_length = plVar13[1];
    *plVar13 = (long)puVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_98 != local_88) {
      operator_delete(local_98,local_88[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_f8);
  }
  else {
    if ((((ConvolutionLayerParams *)puVar12)->kernelsize_).current_size_ == 2) goto LAB_0036273b;
    std::operator+(&local_70,"Offset parameter for the crop layer \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_70);
    paVar1 = &local_b8.field_2;
    puVar16 = (ulong *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_b8.field_2._M_allocated_capacity = *puVar16;
      local_b8.field_2._8_8_ = plVar13[3];
      local_b8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *puVar16;
      local_b8._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_b8._M_string_length = plVar13[1];
    *plVar13 = (long)puVar16;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    if (layer->_oneof_case_[0] == 0xbe) {
      puVar12 = *(undefined1 **)&layer->layer_;
    }
    else {
      puVar12 = Specification::_CropLayerParams_default_instance_;
    }
    uVar3 = (((ConvolutionLayerParams *)puVar12)->kernelsize_).current_size_;
    uVar6 = -uVar3;
    if (0 < (int)uVar3) {
      uVar6 = uVar3;
    }
    uVar19 = 1;
    if (9 < uVar6) {
      uVar17 = (ulong)uVar6;
      uVar7 = 4;
      do {
        uVar19 = uVar7;
        uVar15 = (uint)uVar17;
        if (uVar15 < 100) {
          uVar19 = uVar19 - 2;
          goto LAB_00362ac0;
        }
        if (uVar15 < 1000) {
          uVar19 = uVar19 - 1;
          goto LAB_00362ac0;
        }
        if (uVar15 < 10000) goto LAB_00362ac0;
        uVar17 = uVar17 / 10000;
        uVar7 = uVar19 + 4;
      } while (99999 < uVar15);
      uVar19 = uVar19 + 1;
    }
LAB_00362ac0:
    local_98 = local_88;
    std::__cxx11::string::_M_construct((ulong)&local_98,(char)uVar19 - (char)((int)uVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_98),uVar19,uVar6);
    uVar18 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      uVar18 = local_b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar18 < local_90 + local_b8._M_string_length) {
      uVar17 = 0xf;
      if (local_98 != local_88) {
        uVar17 = local_88[0];
      }
      if (uVar17 < local_90 + local_b8._M_string_length) goto LAB_00362b2f;
      puVar14 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_98,0,(char *)0x0,(ulong)local_b8._M_dataplus._M_p);
    }
    else {
LAB_00362b2f:
      puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_98);
    }
    local_d8 = &local_c8;
    plVar13 = puVar14 + 2;
    if ((long *)*puVar14 == plVar13) {
      local_c8 = *plVar13;
      uStack_c0 = puVar14[3];
    }
    else {
      local_c8 = *plVar13;
      local_d8 = (long *)*puVar14;
    }
    local_d0 = puVar14[1];
    *puVar14 = plVar13;
    puVar14[1] = 0;
    *(undefined1 *)plVar13 = 0;
    puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    puVar16 = puVar14 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_f8.field_2._M_allocated_capacity = *puVar16;
      local_f8.field_2._8_8_ = puVar14[3];
    }
    else {
      local_f8.field_2._M_allocated_capacity = *puVar16;
      local_f8._M_dataplus._M_p = (pointer)*puVar14;
    }
    local_f8._M_string_length = puVar14[1];
    *puVar14 = puVar16;
    puVar14[1] = 0;
    *(undefined1 *)(puVar14 + 2) = 0;
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_98 != local_88) {
      operator_delete(local_98,local_88[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
    return __return_storage_ptr__;
  }
LAB_00362c6e:
  operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateCropLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 2));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Crop", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Crop", 3, -1, blobNameToRank));

        if (layer.input_size() > 1) {
            if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end() &&
                blobNameToRank.find(layer.input(1)) != blobNameToRank.end()) {
                if (blobNameToRank.at(layer.input(0)) != blobNameToRank.at(layer.input(1))) {
                    std::string err;
                    err = "Layer '" + std::string(layer.name()) + "' of type 'Crop' expects equal ranks for its inputs, but they are not equal.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    if (layer.input_size() == 1) {
        // check the border amounts
        if (layer.crop().cropamounts().borderamounts_size() != 2) {
            std::string err = "cropAmounts parameter for the crop layer '" + layer.name() + "' is of length " + std::to_string(layer.crop().cropamounts().borderamounts_size()) + " but requires exactly two crop constraints (for X,Y axes).";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    else { // size == 2 checked above
        // offset must be size 2
        if (layer.crop().offset_size() != 2)  {
            std::string err = "Offset parameter for the crop layer '" + layer.name() + "' is of length " + std::to_string(layer.crop().offset_size()) + " but requires exactly two offsets (for X,Y axes).";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    return Result();
}